

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O3

int __thiscall QMetaMethod::parameterType(QMetaMethod *this,int index)

{
  int iVar1;
  QMetaType iface;
  
  iface = parameterMetaType(this,index);
  if (iface.d_ptr == (QMetaTypeInterface *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = ((iface.d_ptr)->typeId)._q_value.super___atomic_base<int>._M_i;
    if (iVar1 == 0) {
      iVar1 = QMetaType::registerHelper(iface.d_ptr);
      return iVar1;
    }
  }
  return iVar1;
}

Assistant:

int QMetaMethod::parameterType(int index) const
{
    return parameterMetaType(index).id();
}